

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# high_primitives.c
# Opt level: O1

void al_draw_rounded_rectangle
               (float x1,float y1,float x2,float y2,float rx,float ry,ALLEGRO_COLOR color,
               float thickness)

{
  undefined8 uVar1;
  uint uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  long lVar5;
  float *pfVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int type;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ALLEGRO_VERTEX vertex_cache [256];
  float local_2458;
  float fStack_2454;
  float fStack_2440;
  undefined8 uStack_243c;
  float local_2428;
  float fStack_241c;
  undefined8 local_2418;
  undefined8 uStack_2410;
  undefined8 local_2408;
  float fStack_2404;
  undefined8 uStack_2400;
  float local_23f8;
  undefined8 local_23f4;
  undefined8 uStack_23ec;
  undefined8 local_23e4;
  undefined8 uStack_23dc;
  float local_23d4;
  
  uStack_243c._4_4_ = x1;
  local_2428 = y1;
  fVar14 = get_scale();
  fVar15 = (rx + ry) * 0.5;
  if (fVar15 < 0.0) {
    fVar15 = sqrtf(fVar15);
  }
  else {
    fVar15 = SQRT(fVar15);
  }
  uVar2 = (uint)(fVar14 * 10.0 * fVar15 * 0.25);
  local_2458 = color.r;
  fStack_2454 = color.g;
  if (thickness <= 0.0) {
    if ((int)uVar2 < 2) goto LAB_00107458;
    uVar8 = 0x3f;
    if ((int)uVar2 < 0x3f) {
      uVar8 = uVar2;
    }
    iVar9 = uVar8 + 1;
    fVar14 = 1.5707964 / ((float)iVar9 + -1.0);
    fVar15 = cosf(fVar14);
    fVar14 = sinf(fVar14);
    fVar17 = 1.0;
    fVar18 = 0.0;
    puVar3 = &local_2418;
    do {
      *puVar3 = CONCAT44(ry * fVar18 + 0.0,rx * fVar17 + 0.0);
      puVar3 = (undefined8 *)((long)puVar3 + 0x24);
      fVar16 = fVar17 * fVar14;
      fVar17 = fVar17 * fVar15 + fVar18 * -fVar14;
      fVar18 = fVar16 + fVar18 * fVar15;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    lVar7 = (ulong)(uVar8 * 2) * 0x24;
    lVar5 = (ulong)uVar8 * 0x24;
    lVar10 = -0x24;
    lVar11 = 0;
    do {
      uVar1 = *(undefined8 *)((long)&local_2418 + lVar10 + lVar5);
      *(ulong *)((long)&local_2418 + lVar11 + lVar5) =
           CONCAT44((local_2428 + ry) - (float)((ulong)uVar1 >> 0x20),
                    (uStack_243c._4_4_ + rx) - (float)uVar1);
      *(float *)((long)&local_2418 + lVar11 + lVar7) =
           (uStack_243c._4_4_ + rx) - *(float *)((long)&local_2418 + lVar11);
      *(float *)((long)&local_2418 + lVar11 + lVar7 + 4) =
           *(float *)((long)&local_2418 + lVar11 + 4) + (y2 - ry);
      uVar1 = *(undefined8 *)((long)&local_2418 + lVar10 + lVar5);
      *(ulong *)((long)&local_2418 + lVar11 + (ulong)(uVar8 * 3) * 0x24) =
           CONCAT44((float)((ulong)uVar1 >> 0x20) + (y2 - ry),(float)uVar1 + (x2 - rx));
      lVar11 = lVar11 + 0x24;
      lVar10 = lVar10 + -0x24;
    } while (lVar5 != lVar11);
    uVar4 = 1;
    if (1 < (int)uVar8) {
      uVar4 = (ulong)uVar8;
    }
    lVar7 = 0;
    do {
      *(float *)((long)&local_2418 + lVar7) = *(float *)((long)&local_2418 + lVar7) + (x2 - rx);
      *(float *)((long)&local_2418 + lVar7 + 4) =
           (local_2428 + ry) - *(float *)((long)&local_2418 + lVar7 + 4);
      lVar7 = lVar7 + 0x24;
    } while (uVar4 * 0x24 != lVar7);
    iVar9 = uVar8 * 4;
    lVar7 = 0;
    do {
      *(float *)((long)&fStack_2404 + lVar7) = local_2458;
      *(float *)((long)&uStack_2400 + lVar7) = fStack_2454;
      *(float *)((long)&uStack_2400 + lVar7 + 4) = color.b;
      *(float *)((long)&local_23f8 + lVar7) = color.a;
      *(undefined4 *)((long)&uStack_2410 + lVar7) = 0;
      lVar7 = lVar7 + 0x24;
    } while ((ulong)(iVar9 + (uint)(iVar9 == 0)) * 0x24 != lVar7);
    type = 2;
  }
  else {
    if ((int)uVar2 < 2) {
LAB_00107458:
      al_draw_rectangle(uStack_243c._4_4_,local_2428,x2,y2,color,thickness);
      return;
    }
    uVar8 = 0x1f;
    if ((int)(uVar2 * 8 + 2) < 0x100) {
      uVar8 = uVar2;
    }
    al_calculate_arc((float *)&local_2418,0x24,0.0,0.0,rx,ry,0.0,1.5707964,thickness,uVar8);
    fVar14 = local_2428;
    uVar4 = (ulong)(uVar8 * 2);
    fVar17 = uStack_243c._4_4_ + rx;
    fVar18 = local_2428 + ry;
    fVar15 = y2 - ry;
    lVar5 = (ulong)(uVar8 * 6) * 0x24;
    lVar7 = (ulong)(uVar8 * 4) * 0x24 + 0x28;
    lVar10 = uVar4 * 0x24;
    lVar11 = uVar4 * 0x24 + -0x24;
    lVar12 = 0x28;
    uVar13 = 0;
    do {
      *(ulong *)((long)&local_23f4 + lVar10) =
           CONCAT44(fVar18 - (float)((ulong)*(undefined8 *)((long)&local_2418 + lVar11) >> 0x20),
                    fVar17 - (float)*(undefined8 *)((long)&local_2418 + lVar11));
      *(ulong *)((long)&local_2418 + lVar10) =
           CONCAT44(fVar18 - (float)((ulong)*(undefined8 *)((long)&uStack_243c + lVar11) >> 0x20),
                    fVar17 - (float)*(undefined8 *)((long)&uStack_243c + lVar11));
      *(float *)((long)&fStack_2440 + lVar7) = fVar17 - *(float *)((long)&fStack_2440 + lVar12);
      *(float *)((long)&uStack_243c + lVar7) = *(float *)((long)&uStack_243c + lVar12) + fVar15;
      *(float *)((long)&fStack_241c + lVar7) = fVar17 - *(float *)((long)&fStack_241c + lVar12);
      *(float *)((long)&local_2418 + lVar7) = *(float *)((long)&local_2418 + lVar12) + fVar15;
      *(ulong *)((long)&local_23f4 + lVar5) =
           CONCAT44((float)((ulong)*(undefined8 *)((long)&local_2418 + lVar11) >> 0x20) + fVar15,
                    (float)*(undefined8 *)((long)&local_2418 + lVar11) + (x2 - rx));
      *(ulong *)((long)&local_2418 + lVar5) =
           CONCAT44((float)((ulong)*(undefined8 *)((long)&uStack_243c + lVar11) >> 0x20) + fVar15,
                    (float)*(undefined8 *)((long)&uStack_243c + lVar11) + (x2 - rx));
      uVar13 = uVar13 + 2;
      lVar5 = lVar5 + 0x48;
      lVar7 = lVar7 + 0x48;
      lVar10 = lVar10 + 0x48;
      lVar11 = lVar11 + -0x48;
      lVar12 = lVar12 + 0x48;
    } while (uVar13 < uVar4);
    pfVar6 = (float *)((long)&local_23f4 + 4);
    uVar13 = 0;
    do {
      pfVar6[-10] = pfVar6[-10] + (x2 - rx);
      pfVar6[-9] = (fVar14 + ry) - pfVar6[-9];
      pfVar6[-1] = pfVar6[-1] + (x2 - rx);
      *pfVar6 = (fVar14 + ry) - *pfVar6;
      uVar13 = uVar13 + 2;
      pfVar6 = pfVar6 + 0x12;
    } while (uVar13 < uVar4);
    uVar4 = (ulong)(uVar8 * 8);
    lVar7 = uVar4 * 0x24;
    (&local_23f8)[uVar4 * 9] = local_23f8;
    *(undefined8 *)((long)&stack0xffffffffffffdbf8 + lVar7) = local_2408;
    *(undefined8 *)((long)&uStack_2400 + lVar7) = uStack_2400;
    *(undefined8 *)((long)&local_2418 + lVar7) = local_2418;
    *(undefined8 *)((long)&uStack_2410 + lVar7) = uStack_2410;
    uVar13 = (ulong)(uVar8 * 8 + 1);
    (&local_23f8)[uVar13 * 9] = local_23d4;
    *(undefined8 *)((long)&stack0xffffffffffffdbf8 + uVar13 * 0x24) = local_23e4;
    *(undefined8 *)((long)&uStack_2400 + uVar13 * 0x24) = uStack_23dc;
    *(undefined8 *)((long)&local_2418 + uVar13 * 0x24) = local_23f4;
    *(undefined8 *)((long)&uStack_2410 + uVar13 * 0x24) = uStack_23ec;
    iVar9 = uVar8 * 8 + 2;
    lVar7 = 0;
    do {
      *(float *)((long)&fStack_2404 + lVar7) = local_2458;
      *(float *)((long)&uStack_2400 + lVar7) = fStack_2454;
      *(float *)((long)&uStack_2400 + lVar7 + 4) = color.b;
      *(float *)((long)&local_23f8 + lVar7) = color.a;
      *(undefined4 *)((long)&uStack_2410 + lVar7) = 0;
      lVar7 = lVar7 + 0x24;
    } while (uVar4 * 0x24 + 0x48 != lVar7);
    type = 4;
  }
  al_draw_prim(&local_2418,(ALLEGRO_VERTEX_DECL *)0x0,(ALLEGRO_BITMAP *)0x0,0,iVar9,type);
  return;
}

Assistant:

void al_draw_rounded_rectangle(float x1, float y1, float x2, float y2,
   float rx, float ry, ALLEGRO_COLOR color, float thickness)
{
   LOCAL_VERTEX_CACHE;
   float scale = get_scale();

   ASSERT(rx >= 0);
   ASSERT(ry >= 0);

   if (thickness > 0) {
      int num_segments = ALLEGRO_PRIM_QUALITY * scale * sqrtf((rx + ry) / 2.0f) / 4;
      int ii;

      /* In case rx and ry are both 0. */
      if (num_segments < 2) {
         al_draw_rectangle(x1, y1, x2, y2, color, thickness);
         return;
      }

      if (8 * num_segments + 2 >= ALLEGRO_VERTEX_CACHE_SIZE) {
         num_segments = (ALLEGRO_VERTEX_CACHE_SIZE - 3) / 8;
      }
      
      al_calculate_arc(&(vertex_cache[0].x), sizeof(ALLEGRO_VERTEX), 0, 0, rx, ry, 0, ALLEGRO_PI / 2, thickness, num_segments);
      
      for (ii = 0; ii < 2 * num_segments; ii += 2) {
         vertex_cache[ii + 2 * num_segments + 1].x = x1 + rx - vertex_cache[2 * num_segments - 1 - ii].x;
         vertex_cache[ii + 2 * num_segments + 1].y = y1 + ry - vertex_cache[2 * num_segments - 1 - ii].y;
         vertex_cache[ii + 2 * num_segments].x = x1 + rx - vertex_cache[2 * num_segments - 1 - ii - 1].x;
         vertex_cache[ii + 2 * num_segments].y = y1 + ry - vertex_cache[2 * num_segments - 1 - ii - 1].y;

         vertex_cache[ii + 4 * num_segments].x = x1 + rx - vertex_cache[ii].x;
         vertex_cache[ii + 4 * num_segments].y = y2 - ry + vertex_cache[ii].y;
         vertex_cache[ii + 4 * num_segments + 1].x = x1 + rx - vertex_cache[ii + 1].x;
         vertex_cache[ii + 4 * num_segments + 1].y = y2 - ry + vertex_cache[ii + 1].y;

         vertex_cache[ii + 6 * num_segments + 1].x = x2 - rx + vertex_cache[2 * num_segments - 1 - ii].x;
         vertex_cache[ii + 6 * num_segments + 1].y = y2 - ry + vertex_cache[2 * num_segments - 1 - ii].y;
         vertex_cache[ii + 6 * num_segments].x = x2 - rx + vertex_cache[2 * num_segments - 1 - ii - 1].x;
         vertex_cache[ii + 6 * num_segments].y = y2 - ry + vertex_cache[2 * num_segments - 1 - ii - 1].y;
      }
      for (ii = 0; ii < 2 * num_segments; ii += 2) {
         vertex_cache[ii].x = x2 - rx + vertex_cache[ii].x;
         vertex_cache[ii].y = y1 + ry - vertex_cache[ii].y;
         vertex_cache[ii + 1].x = x2 - rx + vertex_cache[ii + 1].x;
         vertex_cache[ii + 1].y = y1 + ry - vertex_cache[ii + 1].y;
      }
      vertex_cache[8 * num_segments] = vertex_cache[0];
      vertex_cache[8 * num_segments + 1] = vertex_cache[1];

      for (ii = 0; ii < 8 * num_segments + 2; ii++) {
         vertex_cache[ii].color = color;
         vertex_cache[ii].z = 0;
      }
         
      al_draw_prim(vertex_cache, 0, 0, 0, 8 * num_segments + 2, ALLEGRO_PRIM_TRIANGLE_STRIP);
   } else {
      int num_segments = ALLEGRO_PRIM_QUALITY * scale * sqrtf((rx + ry) / 2.0f) / 4;
      int ii;
      
      /* In case rx and ry are both 0. */
      if (num_segments < 2) {
         al_draw_rectangle(x1, y1, x2, y2, color, thickness);
         return;
      }

      if (num_segments * 4 >= ALLEGRO_VERTEX_CACHE_SIZE) {
         num_segments = (ALLEGRO_VERTEX_CACHE_SIZE - 1) / 4;
      }
      
      al_calculate_arc(&(vertex_cache[0].x), sizeof(ALLEGRO_VERTEX), 0, 0, rx, ry, 0, ALLEGRO_PI / 2, 0, num_segments + 1);

      for (ii = 0; ii < num_segments; ii++) {
         vertex_cache[ii + 1 * num_segments].x = x1 + rx - vertex_cache[num_segments - 1 - ii].x;
         vertex_cache[ii + 1 * num_segments].y = y1 + ry - vertex_cache[num_segments - 1 - ii].y;

         vertex_cache[ii + 2 * num_segments].x = x1 + rx - vertex_cache[ii].x;
         vertex_cache[ii + 2 * num_segments].y = y2 - ry + vertex_cache[ii].y;

         vertex_cache[ii + 3 * num_segments].x = x2 - rx + vertex_cache[num_segments - 1 - ii].x;
         vertex_cache[ii + 3 * num_segments].y = y2 - ry + vertex_cache[num_segments - 1 - ii].y;
      }
      for (ii = 0; ii < num_segments; ii++) {
         vertex_cache[ii].x = x2 - rx + vertex_cache[ii].x;
         vertex_cache[ii].y = y1 + ry - vertex_cache[ii].y;
      }

      for (ii = 0; ii < 4 * num_segments; ii++) {
         vertex_cache[ii].color = color;
         vertex_cache[ii].z = 0;
      }
         
      al_draw_prim(vertex_cache, 0, 0, 0, 4 * num_segments, ALLEGRO_PRIM_LINE_LOOP);
   }
}